

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_get_next_tensor(ggml_context *ctx,ggml_tensor *tensor)

{
  char *mem_buffer;
  ggml_object *obj;
  ggml_tensor *tensor_local;
  ggml_context *ctx_local;
  
  obj = (ggml_object *)tensor[-1].extra;
  while( true ) {
    if (obj == (ggml_object *)0x0) {
      return (ggml_tensor *)0x0;
    }
    if (obj->type == GGML_OBJECT_TYPE_TENSOR) break;
    obj = obj->next;
  }
  return (ggml_tensor *)((long)ctx->mem_buffer + obj->offs);
}

Assistant:

struct ggml_tensor * ggml_get_next_tensor(const struct ggml_context * ctx, struct ggml_tensor * tensor) {
    struct ggml_object * obj = (struct ggml_object *) ((char *)tensor - GGML_OBJECT_SIZE);
    obj = obj->next;

    char * const mem_buffer = ctx->mem_buffer;

    while (obj != NULL) {
        if (obj->type == GGML_OBJECT_TYPE_TENSOR) {
            return (struct ggml_tensor *)(mem_buffer + obj->offs);
        }

        obj = obj->next;
    }

    return NULL;
}